

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall
amrex::FabArrayBase::CPC::CPC
          (CPC *this,BoxArray *dstba,DistributionMapping *dstdm,
          Vector<int,_std::allocator<int>_> *dstidx,IntVect *dstng,BoxArray *srcba,
          DistributionMapping *srcdm,Vector<int,_std::allocator<int>_> *srcidx,IntVect *srcng,
          Periodicity *period,int myproc)

{
  (this->super_CommMetaData).m_threadsafe_loc = false;
  (this->super_CommMetaData).m_threadsafe_rcv = false;
  (this->super_CommMetaData).m_LocTags._M_t.
  super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  .
  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
  ._M_head_impl =
       (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *)
       0x0;
  (this->super_CommMetaData).m_SndTags._M_t.
  super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
  ._M_head_impl =
       (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
        *)0x0;
  (this->super_CommMetaData).m_RcvTags._M_t.
  super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
  ._M_head_impl =
       (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
        *)0x0;
  (this->m_srcbdk).m_ba_id.data = (BARef *)0x0;
  (this->m_srcbdk).m_dm_id.data = (Ref *)0x0;
  (this->m_dstbdk).m_ba_id.data = (BARef *)0x0;
  (this->m_dstbdk).m_dm_id.data = (Ref *)0x0;
  (this->m_srcng).vect[2] = srcng->vect[2];
  *(undefined8 *)(this->m_srcng).vect = *(undefined8 *)srcng->vect;
  *(undefined8 *)(this->m_dstng).vect = *(undefined8 *)dstng->vect;
  (this->m_dstng).vect[2] = dstng->vect[2];
  (this->m_period).period.vect[2] = (period->period).vect[2];
  *(undefined8 *)(this->m_period).period.vect = *(undefined8 *)(period->period).vect;
  this->m_tgco = false;
  BoxArray::BoxArray(&this->m_srcba,srcba);
  BoxArray::BoxArray(&this->m_dstba,dstba);
  this->m_nuse = 0;
  define(this,dstba,dstdm,dstidx,srcba,srcdm,srcidx,myproc);
  return;
}

Assistant:

FabArrayBase::CPC::CPC (const BoxArray& dstba, const DistributionMapping& dstdm,
                        const Vector<int>& dstidx, const IntVect& dstng,
                        const BoxArray& srcba, const DistributionMapping& srcdm,
                        const Vector<int>& srcidx, const IntVect& srcng,
                        const Periodicity& period, int myproc)
    : m_srcbdk(),
      m_dstbdk(),
      m_srcng(srcng),
      m_dstng(dstng),
      m_period(period),
      m_tgco(false),
      m_srcba(srcba),
      m_dstba(dstba),
      m_nuse(0)
{
    this->define(dstba, dstdm, dstidx, srcba, srcdm, srcidx, myproc);
}